

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_D3D_TEXLD(Context *ctx)

{
  uint32 uVar1;
  int iVar2;
  char *opcode;
  
  iVar2 = shader_version_atleast(ctx,'\x02','\0');
  if (iVar2 == 0) {
    iVar2 = shader_version_atleast(ctx,'\x01','\x04');
    if (iVar2 != 0) {
      emit_D3D_opcode_ds(ctx,"texld");
      return;
    }
    emit_D3D_opcode_d(ctx,"tex");
    return;
  }
  uVar1 = ctx->instruction_controls;
  if (uVar1 == 2) {
    opcode = "texldb";
  }
  else if (uVar1 == 1) {
    opcode = "texldp";
  }
  else {
    if (uVar1 != 0) {
      return;
    }
    opcode = "texld";
  }
  emit_D3D_opcode_dss(ctx,opcode);
  return;
}

Assistant:

static void emit_D3D_TEXLD(Context *ctx)
{
    // this opcode looks and acts differently depending on the shader model.
    if (shader_version_atleast(ctx, 2, 0))
    {
        if (ctx->instruction_controls == CONTROL_TEXLD)
           emit_D3D_opcode_dss(ctx, "texld");
        else if (ctx->instruction_controls == CONTROL_TEXLDP)
           emit_D3D_opcode_dss(ctx, "texldp");
        else if (ctx->instruction_controls == CONTROL_TEXLDB)
           emit_D3D_opcode_dss(ctx, "texldb");
    } // if

    else if (shader_version_atleast(ctx, 1, 4))
    {
        emit_D3D_opcode_ds(ctx, "texld");
    } // else if

    else
    {
        emit_D3D_opcode_d(ctx, "tex");
    } // else
}